

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateToken::UpdateModifier
          (TemplateToken *this,
          vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *auto_modvals)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *this_00;
  pointer *ppMVar1;
  XssClass XVar2;
  ModifierInfo *pMVar3;
  pointer pMVar4;
  ModifierAndValue *pMVar5;
  iterator iVar6;
  char *pcVar7;
  bool bVar8;
  ulong uVar9;
  ostream *poVar10;
  ModifierInfo *pMVar11;
  ulong uVar12;
  ModifierInfo *extraout_RDX;
  ModifierInfo *pMVar13;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals;
  pointer pMVar14;
  pointer ppMVar15;
  pointer ppMVar16;
  pointer ppMVar17;
  string before;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->modvals;
  pMVar11 = (ModifierInfo *)
            (this->modvals).
            super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (ModifierInfo *)
           (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar11 == pMVar3) {
    for (ppMVar15 = (auto_modvals->
                    super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        ppMVar15 !=
        (auto_modvals->
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
      pMVar5 = *ppMVar15;
      iVar6._M_current =
           (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->modvals).
          super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>::
        _M_realloc_insert<ctemplate::ModifierAndValue_const&>
                  ((vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>
                    *)this_00,iVar6,pMVar5);
      }
      else {
        (iVar6._M_current)->value_len = pMVar5->value_len;
        pcVar7 = pMVar5->value;
        (iVar6._M_current)->modifier_info = pMVar5->modifier_info;
        (iVar6._M_current)->value = pcVar7;
        ppMVar1 = &(this->modvals).
                   super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
  }
  else {
    pMVar13 = (ModifierInfo *)
              (((_Vector_impl *)&(pMVar11->long_name)._M_dataplus)->super__Vector_impl_data).
              _M_start;
    if (pMVar13->xss_class != XSS_SAFE) {
      do {
        pMVar11 = (ModifierInfo *)((long)&(pMVar11->long_name).field_2 + 8);
        if (pMVar11 == pMVar3) goto LAB_0011f296;
        pMVar13 = pMVar11;
      } while (*(int *)((long)&(((_Vector_impl *)&(pMVar11->long_name)._M_dataplus)->
                               super__Vector_impl_data)._M_start[1].value + 4) != 3);
      if (pMVar11 == pMVar3) {
LAB_0011f296:
        ppMVar15 = (auto_modvals->
                   super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar15 !=
            (auto_modvals->
            super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          do {
            ppMVar17 = ppMVar15;
            if ((ppMVar15 !=
                 (auto_modvals->
                 super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                 )._M_impl.super__Vector_impl_data._M_start) &&
               (pMVar14 = (this->modvals).
                          super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
               pMVar14 !=
               (this->modvals).
               super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              do {
                pMVar14 = pMVar14 + -1;
                ppMVar16 = ppMVar17 + -1;
                bVar8 = IsSafeXSSAlternative(ppMVar17[-1]->modifier_info,pMVar14->modifier_info);
                pMVar13 = extraout_RDX;
                if (((!bVar8) &&
                    ((XVar2 = pMVar14->modifier_info->xss_class, XVar2 == XSS_UNIQUE ||
                     (pMVar5 = *ppMVar16, ppMVar16 = ppMVar17,
                     XVar2 != pMVar5->modifier_info->xss_class)))) ||
                   (ppMVar17 = ppMVar16,
                   ppMVar16 ==
                   (auto_modvals->
                   super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)) break;
              } while (pMVar14 !=
                       (this_00->
                       super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                       )._M_impl.super__Vector_impl_data._M_start);
            }
            ppMVar16 = (auto_modvals->
                       super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            uVar12 = (long)ppMVar15 - (long)ppMVar17 >> 3;
            if (ppMVar17 == ppMVar16) goto LAB_0011f348;
            ppMVar15 = ppMVar15 + -1;
          } while (ppMVar15 != ppMVar16);
        }
        uVar12 = 0;
LAB_0011f348:
        uVar9 = (long)(auto_modvals->
                      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(auto_modvals->
                      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar12 != uVar9) {
          if (uVar9 <= uVar12) {
            __assert_fail("longest_match >= 0 && longest_match < auto_modvals.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                          ,0x31d,
                          "void ctemplate::TemplateToken::UpdateModifier(const vector<const ModifierAndValue *> &)"
                         );
          }
          pMVar14 = (this->modvals).
                    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar4 = (this->modvals).
                   super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar8 = pMVar14 == pMVar4;
          if (!bVar8) {
            pMVar13 = pMVar14->modifier_info;
            XVar2 = pMVar13->xss_class;
            while (XVar2 != XSS_WEB_STANDARD) {
              pMVar14 = pMVar14 + 1;
              bVar8 = pMVar14 == pMVar4;
              if (bVar8) break;
              pMVar13 = pMVar14->modifier_info;
              XVar2 = pMVar13->xss_class;
            }
          }
          (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                    (&local_50,(_anonymous_namespace_ *)this_00,
                     (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                      *)pMVar13);
          for (ppMVar15 = (auto_modvals->
                          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar12;
              ppMVar15 !=
              (auto_modvals->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
            pMVar5 = *ppMVar15;
            iVar6._M_current =
                 (this->modvals).
                 super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->modvals).
                super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>::
              _M_realloc_insert<ctemplate::ModifierAndValue_const&>
                        ((vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>
                          *)this_00,iVar6,pMVar5);
            }
            else {
              (iVar6._M_current)->value_len = pMVar5->value_len;
              pcVar7 = pMVar5->value;
              (iVar6._M_current)->modifier_info = pMVar5->modifier_info;
              (iVar6._M_current)->value = pcVar7;
              ppMVar1 = &(this->modvals).
                         super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppMVar1 = *ppMVar1 + 1;
            }
          }
          if (!bVar8) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Token: ",7);
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,this->text,this->text + this->textlen);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_d0,local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," has missing in-template modifiers. You gave ",0x2d);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_50._M_dataplus._M_p,local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," and we computed ",0x11);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
            PrettyPrintModifiers(&local_70,auto_modvals,&local_90);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_70._M_dataplus._M_p,local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,". We changed to ",0x10);
            (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                      (&local_b0,(_anonymous_namespace_ *)this_00,modvals);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if (local_d0 != local_c0) {
              operator_delete(local_d0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void UpdateModifier(const vector<const ModifierAndValue*>& auto_modvals) {
    // Common case: no modifiers given in template. Assign our own. No warning.
    if (modvals.empty()) {
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin(); it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      return;
    }

    // Look for any XSS-Safe modifiers (added via AddXssSafeModifier or :none).
    // If one is found anywhere in the vector, consider the variable safe.
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end(); ++it) {
      if (it->modifier_info->xss_class == XSS_SAFE)
        return;
    }

    size_t longest_match = FindLongestMatch(modvals, auto_modvals);
    if (longest_match == auto_modvals.size()) {
      return;             // We have a complete match, nothing to do.
    } else {              // Copy missing ones and issue warning.
      assert(longest_match >= 0 && longest_match < auto_modvals.size());
      // We only log if one or more of the in-template modifiers was
      // escaping-related which we infer from the XssClass. Currently,
      // all escaping modifiers are in XSS_WEB_STANDARD except for 'none'
      // but that one is handled above.
      bool do_log = false;
      for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
           it != modvals.end(); ++it) {
        if (it->modifier_info->xss_class == XSS_WEB_STANDARD) {
          do_log = true;
          break;
        }
      }
      string before = PrettyPrintTokenModifiers(modvals);  // for logging
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin() + longest_match;
           it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      if (do_log)
        LOG(ERROR)
            << "Token: " << string(text, textlen)
            << " has missing in-template modifiers. You gave " << before
            << " and we computed " << PrettyPrintModifiers(auto_modvals, "")
            << ". We changed to " << PrettyPrintTokenModifiers(modvals) << endl;
    }
  }